

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

String * __thiscall
glcts::LayoutBindingProgram::stageToName_abi_cxx11_
          (String *__return_storage_ptr__,LayoutBindingProgram *this,eStageType stage)

{
  allocator<char> local_2e;
  allocator<char> local_2d [16];
  allocator<char> local_1d;
  eStageType local_1c;
  LayoutBindingProgram *pLStack_18;
  eStageType stage_local;
  LayoutBindingProgram *this_local;
  
  local_1c = stage;
  pLStack_18 = this;
  this_local = (LayoutBindingProgram *)__return_storage_ptr__;
  if (stage == VertexShader) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"VertexShader",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  else if (stage == FragmentShader) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"FragmentShader",&local_1d);
    std::allocator<char>::~allocator(&local_1d);
  }
  else if (stage == ComputeShader) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ComputeShader",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

String stageToName(eStageType stage) const
	{
		switch (stage)
		{
		case FragmentShader:
			return "FragmentShader";
		case VertexShader:
			return "VertexShader";
		case ComputeShader:
			return "ComputeShader";
		default:
			DE_ASSERT(0);
			break;
		}
		return String();
	}